

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandStarted
          (BuildSystemFrontendDelegate *this,Command *command)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  undefined1 local_70 [8];
  SmallString<64U> description;
  BuildSystemFrontendDelegateImpl *impl;
  Command *command_local;
  BuildSystemFrontendDelegate *this_local;
  
  uVar2 = (*(command->super_JobDescriptor)._vptr_JobDescriptor[5])();
  if ((uVar2 & 1) != 0) {
    description.super_SmallVector<char,_64U>.super_SmallVectorStorage<char,_64U>.InlineElts._56_8_ =
         this->impl;
    llvm::SmallString<64U>::SmallString((SmallString<64U> *)local_70);
    if ((*(byte *)(*(long *)(*(long *)(description.super_SmallVector<char,_64U>.
                                       super_SmallVectorStorage<char,_64U>.InlineElts._56_8_ + 0x30)
                            + 0x10) + 2) & 1) == 0) {
      (*(command->super_JobDescriptor)._vptr_JobDescriptor[3])(command,local_70);
      bVar1 = llvm::SmallVectorBase::empty((SmallVectorBase *)local_70);
      if (bVar1) {
        (*(command->super_JobDescriptor)._vptr_JobDescriptor[4])(command,local_70);
      }
    }
    else {
      (*(command->super_JobDescriptor)._vptr_JobDescriptor[4])(command,local_70);
    }
    __stream = _stdout;
    pcVar3 = llvm::SmallString<64U>::c_str((SmallString<64U> *)local_70);
    fprintf(__stream,"%s\n",pcVar3);
    fflush(_stdout);
    llvm::SmallString<64U>::~SmallString((SmallString<64U> *)local_70);
  }
  return;
}

Assistant:

void BuildSystemFrontendDelegate::commandStarted(Command* command) {
  // Don't report status if opted out by the command.
  if (!command->shouldShowStatus()) {
    return;
  }

  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);

  // Log the command.
  //
  // FIXME: Design the logging and status output APIs.
  SmallString<64> description;
  if (impl->frontend->invocation.showVerboseStatus) {
    command->getVerboseDescription(description);
  } else {
    command->getShortDescription(description);

    // If the short description is empty, always show the verbose one.
    if (description.empty()) {
      command->getVerboseDescription(description);
    }
  }
  fprintf(stdout, "%s\n", description.c_str());
  fflush(stdout);
}